

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

permonst * rndmonst(level *lev)

{
  d_level *dlev;
  ushort uVar1;
  mon_gen_override *pmVar2;
  short sVar3;
  mon_gen_tuple *pmVar4;
  boolean bVar5;
  xchar xVar6;
  boolean bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  ushort **ppuVar11;
  s_level *psVar12;
  d_flags *pdVar13;
  char cVar14;
  short sVar15;
  uint uVar16;
  int iVar17;
  permonst *ppVar18;
  ulong uVar19;
  bool bVar20;
  
  dlev = &lev->z;
  if (lev->mon_gen != (mon_gen_override *)0x0) {
    uVar9 = mt_random();
    pmVar2 = lev->mon_gen;
    if ((int)(uVar9 % 100) < pmVar2->override_chance) {
      iVar10 = pmVar2->total_mon_freq;
      uVar9 = mt_random();
      pmVar4 = pmVar2->gen_chances;
      iVar10 = SUB164(ZEXT416(uVar9) % SEXT816((long)iVar10),0) + 1;
      uVar9 = 100;
joined_r0x001be5e9:
      do {
        iVar17 = iVar10;
        if (pmVar4 != (mon_gen_tuple *)0x0) {
          iVar17 = iVar10 - pmVar4->freq;
          if (iVar17 != 0 && pmVar4->freq <= iVar10) {
            pmVar4 = pmVar4->next;
            iVar10 = iVar17;
            goto joined_r0x001be5e9;
          }
          iVar10 = pmVar4->monid;
          if (pmVar4->is_sym != '\0') {
            ppVar18 = mkclass(dlev,(char)iVar10,0);
            if (ppVar18 != (permonst *)0x0) {
              return ppVar18;
            }
            break;
          }
          if ((mvitals[iVar10].mvflags & 2) == 0) {
            return mons + iVar10;
          }
        }
        bVar20 = 1 < uVar9;
        pmVar4 = pmVar2->gen_chances;
        iVar10 = iVar17;
        uVar9 = uVar9 - 1;
      } while (bVar20);
    }
  }
  if (rndmonst_state.choice_count < 0) {
    rndmonst_state.choice_count = 0;
    ppVar18 = mons;
    uVar19 = 0;
    while (bVar5 = uncommon(dlev,(int)uVar19), bVar5 != '\0') {
      rndmonst_state.mchoices[uVar19] = '\0';
      uVar19 = uVar19 + 1;
      ppVar18 = ppVar18 + 1;
      if (uVar19 == 0x158) {
        return (permonst *)0x0;
      }
    }
    xVar6 = level_difficulty(dlev);
    uVar9 = (uint)u.uevent >> 0xd;
    iVar10 = max_monster_difficulty(dlev);
    bVar5 = on_level(dlev,&dungeon_topology.d_rogue_level);
    bVar20 = true;
    if (dlev->dnum == dungeon_topology.d_astral_level.dnum) {
      bVar7 = on_level(dlev,&dungeon_topology.d_astral_level);
      bVar20 = bVar7 != '\0';
    }
    if (uVar19 < 0x158) {
      do {
        rndmonst_state.mchoices[uVar19] = '\0';
        if ((((int)(xVar6 / (char)(((uVar9 & 1) == 0) * '\x02' | 4U)) <= monstr[uVar19]) &&
            (monstr[uVar19] <= iVar10)) &&
           ((bVar5 == '\0' ||
            (ppuVar11 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar11 + (ulong)(byte)""[ppVar18->mlet] * 2 + 1) & 1) != 0)))) {
          if (!bVar20) {
            cVar14 = ppVar18->mlet;
            if (cVar14 == '\x1f') {
              bVar8 = is_home_elemental(dlev,ppVar18);
            }
            else {
              bVar7 = on_level(dlev,&dungeon_topology.d_earth_level);
              if (bVar7 != '\0') goto LAB_001be791;
              bVar7 = on_level(dlev,&dungeon_topology.d_water_level);
              if (bVar7 == '\0') {
                bVar7 = on_level(dlev,&dungeon_topology.d_fire_level);
                if (bVar7 == '\0') {
                  bVar7 = on_level(dlev,&dungeon_topology.d_air_level);
                  if (bVar7 != '\0') {
                    if ((ppVar18->mflags1 & 1) == 0) {
                      if (cVar14 != '\x05') {
LAB_001be939:
                        if (((cVar14 != '6' && (char)((ppVar18->mflags1 & 4) >> 2) == '\0') &&
                            (uVar19 != 0x9f)) && (cVar14 != '\x16')) goto LAB_001be8c3;
                      }
                    }
                    else if (cVar14 == '\x14') goto LAB_001be939;
                  }
                  goto LAB_001be791;
                }
                bVar8 = ppVar18->mresists & 1;
              }
              else {
                bVar8 = (byte)ppVar18->mflags1 & 2;
              }
            }
            if (bVar8 == 0) goto LAB_001be8c3;
          }
LAB_001be791:
          bVar7 = uncommon(dlev,(int)uVar19);
          if (((bVar7 == '\0') &&
              ((bVar7 = In_hell(dlev), bVar7 == '\0' || ((ppVar18->geno & 0x800) == 0)))) &&
             (((ppVar18->mflags2 & 0x400000) == 0 ||
              (bVar7 = on_level(dlev,&dungeon_topology.d_blackmarket_level), bVar7 == '\0')))) {
            uVar1 = ppVar18->geno;
            psVar12 = Is_special(dlev);
            if (psVar12 == (s_level *)0x0) {
              pdVar13 = &dungeons[dlev->dnum].flags;
            }
            else {
              pdVar13 = &psVar12->flags;
            }
            uVar16 = (uint)*pdVar13 >> 4 & 7;
            if (uVar16 == 1) {
              sVar15 = 0x14 - ppVar18->maligntyp;
              sVar3 = 0x1b - ppVar18->maligntyp;
              if (-1 < sVar15) {
                sVar3 = sVar15;
              }
LAB_001be897:
              iVar17 = (int)sVar3 >> 3;
            }
            else if (uVar16 == 2) {
              bVar8 = ppVar18->maligntyp >> 7;
              cVar14 = (bVar8 - (ppVar18->maligntyp ^ bVar8)) + '\x14';
              iVar17 = (int)((char)(((byte)(cVar14 >> 7) >> 6) + cVar14) >> 2);
            }
            else {
              iVar17 = 0;
              if (uVar16 == 4) {
                sVar15 = ppVar18->maligntyp + 0x14;
                sVar3 = ppVar18->maligntyp + 0x1b;
                if (-1 < sVar15) {
                  sVar3 = sVar15;
                }
                goto LAB_001be897;
              }
            }
            uVar16 = (uVar1 & 7) + iVar17;
            if ((int)uVar16 < 0) {
              panic("rndmonst: bad count [#%d: %d]",uVar19 & 0xffffffff,(ulong)uVar16);
            }
            rndmonst_state.choice_count = rndmonst_state.choice_count + uVar16;
            rndmonst_state.mchoices[uVar19] = (char)uVar16;
          }
        }
LAB_001be8c3:
        uVar19 = uVar19 + 1;
        ppVar18 = ppVar18 + 1;
      } while (uVar19 != 0x158);
    }
  }
  iVar10 = rndmonst_state.choice_count;
  if (0 < rndmonst_state.choice_count) {
    uVar9 = mt_random();
    uVar19 = 0;
    ppVar18 = mons;
    iVar10 = uVar9 % (uint)iVar10 + 1;
    do {
      iVar17 = iVar10 - rndmonst_state.mchoices[uVar19];
      if (iVar17 == 0 || iVar10 < rndmonst_state.mchoices[uVar19]) {
        bVar5 = uncommon(dlev,(int)uVar19);
        if (bVar5 == '\0') {
          return ppVar18;
        }
        goto LAB_001be9c6;
      }
      uVar19 = uVar19 + 1;
      ppVar18 = ppVar18 + 1;
      iVar10 = iVar17;
    } while (uVar19 != 0x158);
    uVar19 = 0x158;
LAB_001be9c6:
    warning("rndmonst: bad `mndx\' [#%d]",uVar19 & 0xffffffff);
  }
  return (permonst *)0x0;
}

Assistant:

const struct permonst *rndmonst(struct level *lev)
{
	const struct permonst *ptr;
	int mndx, ct;
	const d_level *dlev = &lev->z;

	if (lev->mon_gen &&
	    rn2(100) < lev->mon_gen->override_chance &&
	    (ptr = get_override_mon(&lev->z, lev->mon_gen)) != NULL)
	    return ptr;

	if (rndmonst_state.choice_count < 0) {	/* need to recalculate */
	    int minmlev, maxmlev;
	    boolean elemlevel;
	    boolean upper;

	    rndmonst_state.choice_count = 0;
	    /* look for first common monster */
	    for (mndx = LOW_PM; mndx < SPECIAL_PM; mndx++) {
		if (!uncommon(dlev, mndx)) break;
		rndmonst_state.mchoices[mndx] = 0;
	    }		
	    if (mndx == SPECIAL_PM) {
		/* evidently they've all been exterminated */
		return NULL;
	    } /* else `mndx' now ready for use below */
	    minmlev = min_monster_difficulty(dlev);
	    maxmlev = max_monster_difficulty(dlev);
	    upper = Is_rogue_level(dlev);
	    elemlevel = In_endgame(dlev) && !Is_astralevel(dlev);

/*
 *	Find out how many monsters exist in the range we have selected.
 */
	    /* (`mndx' initialized above) */
	    for ( ; mndx < SPECIAL_PM; mndx++) {
		ptr = &mons[mndx];
		rndmonst_state.mchoices[mndx] = 0;
		if (tooweak(mndx, minmlev) || toostrong(mndx, maxmlev))
		    continue;
		if (upper && !isupper((uchar)def_monsyms[(int)(ptr->mlet)])) continue;
		if (elemlevel && wrong_elem_type(dlev, ptr)) continue;
		if (uncommon(dlev, mndx)) continue;
		if (In_hell(dlev) && (ptr->geno & G_NOHELL)) continue;
		/* SWD: pets are not allowed in the black market */
		if (is_domestic(ptr) && Is_blackmarket(dlev)) continue;
		ct = (int)(ptr->geno & G_FREQ) + align_shift(dlev, ptr);
		if (ct < 0 || ct > 127)
		    panic("rndmonst: bad count [#%d: %d]", mndx, ct);
		rndmonst_state.choice_count += ct;
		rndmonst_state.mchoices[mndx] = (char)ct;
	    }
/*
 *	    Possible modification:  if choice_count is "too low",
 *	    expand minmlev..maxmlev range and try again.
 */
	} /* choice_count+mchoices[] recalc */

	if (rndmonst_state.choice_count <= 0) {
	    /* maybe no common mons left, or all are too weak or too strong */
	    return NULL;
	}

/*
 *	Now, select a monster at random.
 */
	ct = rnd(rndmonst_state.choice_count);
	for (mndx = LOW_PM; mndx < SPECIAL_PM; mndx++)
	    if ((ct -= (int)rndmonst_state.mchoices[mndx]) <= 0) break;

	if (mndx == SPECIAL_PM || uncommon(dlev, mndx)) {	/* shouldn't happen */
	    warning("rndmonst: bad `mndx' [#%d]", mndx);
	    return NULL;
	}
	return &mons[mndx];
}